

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O2

void process_COM(int raw)

{
  uint uVar1;
  uint __c;
  ushort **ppuVar2;
  int iVar3;
  bool bVar4;
  
  setlocale(0,"");
  uVar1 = read_2_bytes();
  if (uVar1 < 2) {
    fprintf(_stderr,"%s\n","Erroneous JPEG marker length");
    exit(1);
  }
  iVar3 = uVar1 - 2;
  uVar1 = 0;
LAB_001016ac:
  do {
    while( true ) {
      bVar4 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar4) {
        putchar(10);
        setlocale(0,"C");
        return;
      }
      __c = read_1_byte();
      if (raw == 0) break;
LAB_001016c1:
      putc(__c,_stdout);
      uVar1 = __c;
    }
    if (__c == 10) break;
    if (__c != 0x5c) {
      if (__c == 0xd) goto LAB_00101728;
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)(int)__c * 2 + 1) & 0x40) != 0) goto LAB_001016c1;
      printf("\\%03o",(ulong)__c);
      uVar1 = __c;
      goto LAB_001016ac;
    }
    printf("\\\\");
    uVar1 = __c;
  } while( true );
  bVar4 = uVar1 != 0xd;
  uVar1 = __c;
  if (bVar4) {
LAB_00101728:
    putchar(10);
    uVar1 = __c;
  }
  goto LAB_001016ac;
}

Assistant:

static void
process_COM(int raw)
{
  unsigned int length;
  int ch;
  int lastch = 0;

  /* Bill Allombert: set locale properly for isprint */
#ifdef HAVE_LOCALE_H
  setlocale(LC_CTYPE, "");
#endif

  /* Get the marker parameter length count */
  length = read_2_bytes();
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;

  while (length > 0) {
    ch = read_1_byte();
    if (raw) {
      putc(ch, stdout);
    /* Emit the character in a readable form.
     * Nonprintables are converted to \nnn form,
     * while \ is converted to \\.
     * Newlines in CR, CR/LF, or LF form will be printed as one newline.
     */
    } else if (ch == '\r') {
      printf("\n");
    } else if (ch == '\n') {
      if (lastch != '\r')
        printf("\n");
    } else if (ch == '\\') {
      printf("\\\\");
    } else if (isprint(ch)) {
      putc(ch, stdout);
    } else {
      printf("\\%03o", ch);
    }
    lastch = ch;
    length--;
  }
  printf("\n");

  /* Bill Allombert: revert to C locale */
#ifdef HAVE_LOCALE_H
  setlocale(LC_CTYPE, "C");
#endif
}